

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_BREAKP(Context *ctx)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  
  if (ctx->source_args[0].regtype == REG_TYPE_MAX) {
    uVar1 = ctx->source_args[0].swizzle;
    uVar2 = uVar1 >> 2 & 3;
    pcVar3 = "BREAKP without replicate swizzzle";
    if ((((uVar1 & 3) == uVar2) && (uVar4 = uVar1 >> 4 & 3, uVar2 == uVar4)) &&
       (uVar4 == (uVar1 >> 6 & 3))) {
      if ((ctx->loops != 0) || (ctx->reps != 0)) {
        return;
      }
      pcVar3 = "BREAKP outside LOOP/ENDLOOP or REP/ENDREP";
    }
  }
  else {
    pcVar3 = "BREAKP argument isn\'t predicate register";
  }
  failf(ctx,"%s",pcVar3);
  return;
}

Assistant:

static void state_BREAKP(Context *ctx)
{
    const RegisterType regtype = ctx->source_args[0].regtype;
    if (regtype != REG_TYPE_PREDICATE)
        fail(ctx, "BREAKP argument isn't predicate register");
    else if (!replicate_swizzle(ctx->source_args[0].swizzle))
        fail(ctx, "BREAKP without replicate swizzzle");
    else if ((ctx->loops == 0) && (ctx->reps == 0))
        fail(ctx, "BREAKP outside LOOP/ENDLOOP or REP/ENDREP");
}